

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependenceAnalysisImpl.h
# Opt level: O0

void __thiscall
dg::dda::DataDependenceAnalysisImpl::~DataDependenceAnalysisImpl(DataDependenceAnalysisImpl *this)

{
  code *pcVar1;
  DataDependenceAnalysisImpl *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DataDependenceAnalysisImpl() = default;